

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

void __thiscall CPU::MOS6502::State::ExecutionState::ExecutionState(ExecutionState *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  (this->super_StructImpl<CPU::MOS6502::State::ExecutionState>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__005a1aa8;
  if (Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::contents__abi_cxx11_._M_h.
      _M_element_count == 0) {
    Reflection::Enum::declare<CPU::MOS6502::State::ExecutionState::Phase>
              ("Phase","Instruction, Stopped, Waiting, Jammed, Ready");
    paVar1 = &local_30.field_2;
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"phase","");
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::
    declare_emplace<CPU::MOS6502::State::ExecutionState::Phase>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->phase,&local_30,1
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"micro_program","");
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare_emplace<int>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->micro_program,
               &local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"micro_program_offset","");
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare_emplace<int>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,
               &this->micro_program_offset,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"operation","");
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->operation,
               &local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"operand","");
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->operand,&local_30
               ,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"address","");
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->address,&local_30
               ,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"next_address","");
    Reflection::StructImpl<CPU::MOS6502::State::ExecutionState>::declare_emplace<unsigned_short>
              (&this->super_StructImpl<CPU::MOS6502::State::ExecutionState>,&this->next_address,
               &local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

State::ExecutionState::ExecutionState() {
	if(needs_declare()) {
		AnnounceEnum(Phase);
		DeclareField(phase);
		DeclareField(micro_program);
		DeclareField(micro_program_offset);
		DeclareField(operation);
		DeclareField(operand);
		DeclareField(address);
		DeclareField(next_address);
	}
}